

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O2

char * llama_print_system_info(void)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  code *pcVar4;
  long *plVar5;
  size_t i;
  ulong uVar6;
  
  if (llama_print_system_info::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&llama_print_system_info::s_abi_cxx11_);
    if (iVar1 != 0) {
      llama_print_system_info::s_abi_cxx11_._M_dataplus._M_p =
           (pointer)&llama_print_system_info::s_abi_cxx11_.field_2;
      llama_print_system_info::s_abi_cxx11_._M_string_length = 0;
      llama_print_system_info::s_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&llama_print_system_info::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&llama_print_system_info::s_abi_cxx11_);
    }
  }
  llama_print_system_info::s_abi_cxx11_._M_string_length = 0;
  *llama_print_system_info::s_abi_cxx11_._M_dataplus._M_p = '\0';
  uVar6 = 0;
  while( true ) {
    uVar2 = ggml_backend_reg_count();
    if (uVar2 <= uVar6) break;
    uVar3 = ggml_backend_reg_get(uVar6);
    pcVar4 = (code *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_get_features");
    if (pcVar4 != (code *)0x0) {
      plVar5 = (long *)(*pcVar4)(uVar3);
      ggml_backend_reg_name(uVar3);
      std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
      std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
      for (; *plVar5 != 0; plVar5 = plVar5 + 2) {
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
      }
    }
    uVar6 = uVar6 + 1;
  }
  return llama_print_system_info::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;
    s.clear(); // Clear the string, since it's static, otherwise it will accumulate data from previous calls.

    for (size_t i = 0; i < ggml_backend_reg_count(); i++) {
        auto * reg = ggml_backend_reg_get(i);
        auto * get_features_fn = (ggml_backend_get_features_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_get_features");
        if (get_features_fn) {
            ggml_backend_feature * features = get_features_fn(reg);
            s += ggml_backend_reg_name(reg);
            s += " : ";
            for (; features->name; features++) {
                s += features->name;
                s += " = ";
                s += features->value;
                s += " | ";
            }
        }
    }

    return s.c_str();
}